

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

void __thiscall
polyscope::render::TextureBuffer::TextureBuffer
          (TextureBuffer *this,int dim_,TextureFormat format_,uint sizeX_,uint sizeY_,uint sizeZ_)

{
  uint64_t uVar1;
  string local_58;
  string local_38;
  
  this->_vptr_TextureBuffer = (_func_int **)&PTR__TextureBuffer_005f2988;
  this->dim = dim_;
  this->format = format_;
  this->sizeX = sizeX_;
  this->sizeY = sizeY_;
  this->sizeZ = sizeZ_;
  uVar1 = *(uint64_t *)(render::engine + 0x290);
  *(uint64_t *)(render::engine + 0x290) = uVar1 + 1;
  this->uniqueID = uVar1;
  if (0x400000 < sizeX_) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"OpenGL error: invalid texture dimensions","");
    exception(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  if ((1 < this->dim) && (0x400000 < this->sizeY)) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"OpenGL error: invalid texture dimensions","");
    exception(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

TextureBuffer::TextureBuffer(int dim_, TextureFormat format_, unsigned int sizeX_, unsigned int sizeY_,
                             unsigned int sizeZ_)
    : dim(dim_), format(format_), sizeX(sizeX_), sizeY(sizeY_), sizeZ(sizeZ_),
      uniqueID(render::engine->getNextUniqueID()) {
  if (sizeX > (1 << 22)) exception("OpenGL error: invalid texture dimensions");
  if (dim > 1 && sizeY > (1 << 22)) exception("OpenGL error: invalid texture dimensions");
}